

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OCVWarp.cpp
# Opt level: O0

void update_map(double anglex,double angley,Mat *map_x,Mat *map_y,int transformtype)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  float *pfVar4;
  int iVar5;
  Mat *pMVar6;
  float extraout_XMM0_Da;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float extraout_XMM0_Da_00;
  __type_conflict _Var11;
  __type_conflict _Var12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  Mat *local_ad0;
  int local_a78;
  int local_a74;
  int j_4;
  int i_4;
  float anglexrad_3;
  float angleyrad_3;
  float aperture_3;
  float PzR_3;
  float PyR_3;
  float PxR_3;
  float yequi_1;
  float xequi_1;
  float phi_1;
  float rfish_1;
  float yfish_1;
  float xfish_1;
  float theta_3;
  float Pz_3;
  float Py_3;
  float Px_3;
  float lat_3;
  float longi_3;
  float halfrows_1;
  float halfcols_1;
  int ycd_3;
  int xcd_3;
  int j_3;
  int i_3;
  float anglexrad_2;
  float angleyrad_2;
  float aperture_2;
  float PzR_2;
  float PyR_2;
  float PxR_2;
  float yequi;
  float xequi;
  float phi;
  float rfish;
  float yfish;
  float xfish;
  float theta_2;
  float Pz_2;
  float Py_2;
  float Px_2;
  float lat_2;
  float longi_2;
  float halfrows;
  float halfcols;
  int ycd_2;
  int xcd_2;
  int j_2;
  int i_2;
  float anglexrad_1;
  float angleyrad_1;
  float aperture_1;
  float PzR_1;
  float PyR_1;
  float PxR_1;
  float R_1;
  float Pz_1;
  float Py_1;
  float Px_1;
  float lat_1;
  float longi_1;
  float theta_1;
  float rad_per_px_1;
  float px_per_phi_1;
  float px_per_theta_1;
  int ycd_1;
  int xcd_1;
  int j_1;
  int i_1;
  float anglexrad;
  float angleyrad;
  float aperture;
  float PzR;
  float PyR;
  float PxR;
  float R;
  float Pz;
  float Py;
  float Px;
  float lat;
  float longi;
  float theta;
  float rad_per_px;
  float px_per_phi;
  float px_per_theta;
  int ycd;
  int xcd;
  int j;
  int i;
  int colstodiscard;
  int linestodiscard;
  Mat local_8f0 [352];
  _OutputArray local_790;
  Mat local_778 [352];
  _OutputArray local_618;
  Mat *local_600;
  Mat local_5f8 [96];
  Mat local_598 [96];
  Mat local_538 [96];
  Mat aMStack_4d8 [8];
  MatSize local_4d0 [8];
  _OutputArray local_4c8;
  _InputArray local_4b0;
  Size_<int> local_498;
  _OutputArray local_490;
  _InputArray local_478;
  Size_<int> local_460;
  _OutputArray local_458;
  _InputArray local_440;
  int local_424;
  int local_420;
  int extracols;
  int extrarows;
  string local_410;
  undefined1 local_3f0 [8];
  Mat temp;
  Mat local_390 [8];
  Mat indexy;
  Mat local_330 [8];
  Mat indexx;
  Mat local_2d0 [8];
  Mat indexv;
  Mat local_270 [8];
  Mat indexu;
  Mat local_210 [8];
  Mat IC1;
  Mat local_1b0 [8];
  Mat Y;
  Mat local_150 [8];
  Mat X;
  Mat local_f0 [8];
  Mat V;
  Mat local_90 [8];
  Mat U;
  int transformtype_local;
  Mat *map_y_local;
  Mat *map_x_local;
  double angley_local;
  double anglex_local;
  
  switch(transformtype) {
  case 0:
  default:
    _Var11 = std::floor<int>(*(int *)(map_x + 0xc) / 2);
    pMVar6 = (Mat *)((long)*(int *)(map_x + 8) / 2 & 0xffffffff);
    _Var12 = std::floor<int>((int)((long)*(int *)(map_x + 8) / 2));
    iVar1 = *(int *)(map_x + 0xc);
    iVar2 = *(int *)(map_x + 8);
    fVar7 = (float)((-angley * 3.141592653589793) / 180.0);
    fVar8 = (float)((-anglex * 3.141592653589793) / 180.0);
    for (local_a74 = 0; local_a74 < *(int *)(map_x + 8); local_a74 = local_a74 + 1) {
      for (local_a78 = 0; local_a78 < *(int *)(map_x + 0xc); local_a78 = local_a78 + 1) {
        fVar9 = (float)(local_a78 - (int)(_Var11 - 1.0)) / (float)(iVar1 / 2);
        fVar10 = (float)(local_a74 - (int)(_Var12 - 1.0)) / (float)(iVar2 / 2);
        dVar13 = std::sqrt((double)(ulong)(uint)(fVar9 * fVar9 + fVar10 * fVar10));
        dVar14 = std::atan2((double)(ulong)(uint)fVar10,(double)(ulong)(uint)fVar9);
        fVar9 = (SUB84(dVar13,0) * 6.2831855) / 2.0;
        dVar15 = std::sin((double)(ulong)(uint)fVar9);
        dVar16 = std::cos((double)((ulong)dVar14 & 0xffffffff));
        Pz_3 = SUB84(dVar15,0) * SUB84(dVar16,0);
        dVar15 = std::sin((double)(ulong)(uint)fVar9);
        dVar14 = std::sin((double)((ulong)dVar14 & 0xffffffff));
        theta_3 = SUB84(dVar15,0) * SUB84(dVar14,0);
        dVar14 = std::cos((double)(ulong)(uint)fVar9);
        xfish_1 = SUB84(dVar14,0);
        if (((angley != 0.0) || (NAN(angley))) || ((anglex != 0.0 || (NAN(anglex))))) {
          dVar14 = std::cos((double)(ulong)(uint)fVar7);
          dVar15 = std::sin((double)(ulong)(uint)fVar7);
          fVar9 = SUB84(dVar14,0) * theta_3 + -(SUB84(dVar15,0) * xfish_1);
          dVar14 = std::sin((double)(ulong)(uint)fVar7);
          dVar15 = std::cos((double)(ulong)(uint)fVar7);
          xfish_1 = SUB84(dVar14,0) * theta_3 + SUB84(dVar15,0) * xfish_1;
          dVar14 = std::cos((double)(ulong)(uint)fVar8);
          dVar15 = std::sin((double)(ulong)(uint)fVar8);
          dVar16 = std::sin((double)(ulong)(uint)fVar8);
          dVar17 = std::cos((double)(ulong)(uint)fVar8);
          theta_3 = SUB84(dVar16,0) * Pz_3 + SUB84(dVar17,0) * fVar9;
          Pz_3 = SUB84(dVar14,0) * Pz_3 + -(SUB84(dVar15,0) * fVar9);
        }
        std::atan2((double)(ulong)(uint)theta_3,(double)(ulong)(uint)Pz_3);
        dVar14 = std::sqrt((double)(ulong)(uint)(Pz_3 * Pz_3 + theta_3 * theta_3));
        dVar14 = std::atan2((double)(ulong)(uint)xfish_1,dVar14);
        if (SUB84(dVar13,0) <= 1.1) {
          std::abs((int)pMVar6);
          pfVar4 = cv::Mat::at<float>(map_x,local_a74,local_a78);
          *pfVar4 = extraout_XMM0_Da_00;
          iVar5 = *(int *)(map_x + 8);
          pMVar6 = map_y;
          pfVar4 = cv::Mat::at<float>(map_y,local_a74,local_a78);
          *pfVar4 = (((SUB84(dVar14,0) * 2.0) / 3.1415927) * (float)iVar5) / 2.0 +
                    (float)(int)(_Var12 - 1.0);
        }
      }
    }
    break;
  case 1:
    _Var11 = std::floor<int>(*(int *)(map_x + 0xc) / 2);
    pMVar6 = (Mat *)((long)*(int *)(map_x + 8) / 2 & 0xffffffff);
    _Var12 = std::floor<int>((int)((long)*(int *)(map_x + 8) / 2));
    iVar1 = *(int *)(map_x + 0xc);
    iVar2 = *(int *)(map_x + 8);
    fVar7 = (float)((-angley * 3.141592653589793) / 180.0);
    fVar8 = (float)((-anglex * 3.141592653589793) / 180.0);
    for (xcd_3 = 0; xcd_3 < *(int *)(map_x + 8); xcd_3 = xcd_3 + 1) {
      for (ycd_3 = 0; iVar5 = (int)pMVar6, ycd_3 < *(int *)(map_x + 0xc); ycd_3 = ycd_3 + 1) {
        fVar9 = (float)(ycd_3 - (int)(_Var11 - 1.0)) / (float)(iVar1 / 2);
        fVar10 = (float)(xcd_3 - (int)(_Var12 - 1.0)) / (float)(iVar2 / 2);
        dVar13 = std::sqrt((double)(ulong)(uint)(fVar9 * fVar9 + fVar10 * fVar10));
        dVar14 = std::atan2((double)(ulong)(uint)fVar10,(double)(ulong)(uint)fVar9);
        fVar9 = (SUB84(dVar13,0) * 3.1415927) / 2.0;
        dVar13 = std::sin((double)(ulong)(uint)fVar9);
        dVar15 = std::cos((double)((ulong)dVar14 & 0xffffffff));
        Pz_2 = SUB84(dVar13,0) * SUB84(dVar15,0);
        dVar13 = std::sin((double)(ulong)(uint)fVar9);
        dVar14 = std::sin((double)((ulong)dVar14 & 0xffffffff));
        theta_2 = SUB84(dVar13,0) * SUB84(dVar14,0);
        dVar13 = std::cos((double)(ulong)(uint)fVar9);
        xfish = SUB84(dVar13,0);
        if ((((angley != 0.0) || (NAN(angley))) || (anglex != 0.0)) || (NAN(anglex))) {
          dVar13 = std::cos((double)(ulong)(uint)fVar7);
          dVar14 = std::sin((double)(ulong)(uint)fVar7);
          fVar9 = SUB84(dVar13,0) * theta_2 + -(SUB84(dVar14,0) * xfish);
          dVar13 = std::sin((double)(ulong)(uint)fVar7);
          dVar14 = std::cos((double)(ulong)(uint)fVar7);
          xfish = SUB84(dVar13,0) * theta_2 + SUB84(dVar14,0) * xfish;
          dVar13 = std::cos((double)(ulong)(uint)fVar8);
          dVar14 = std::sin((double)(ulong)(uint)fVar8);
          dVar15 = std::sin((double)(ulong)(uint)fVar8);
          dVar16 = std::cos((double)(ulong)(uint)fVar8);
          theta_2 = SUB84(dVar15,0) * Pz_2 + SUB84(dVar16,0) * fVar9;
          Pz_2 = SUB84(dVar13,0) * Pz_2 + -(SUB84(dVar14,0) * fVar9);
        }
        std::atan2((double)(ulong)(uint)theta_2,(double)(ulong)(uint)Pz_2);
        dVar13 = std::sqrt((double)(ulong)(uint)(Pz_2 * Pz_2 + theta_2 * theta_2));
        dVar13 = std::atan2((double)(ulong)(uint)xfish,dVar13);
        std::abs(iVar5);
        pfVar4 = cv::Mat::at<float>(map_x,xcd_3,ycd_3);
        *pfVar4 = extraout_XMM0_Da;
        iVar5 = *(int *)(map_x + 8);
        pMVar6 = map_y;
        pfVar4 = cv::Mat::at<float>(map_y,xcd_3,ycd_3);
        *pfVar4 = (((SUB84(dVar13,0) * 2.0) / 3.1415927) * (float)iVar5) / 2.0 +
                  (float)(int)(_Var12 - 1.0);
      }
    }
    break;
  case 2:
    _Var11 = std::floor<int>(*(int *)(map_x + 0xc) / 2);
    _Var12 = std::floor<int>(*(int *)(map_x + 8) / 2);
    fVar7 = (float)((-angley * 3.141592653589793) / 180.0);
    fVar8 = (float)((-anglex * 3.141592653589793) / 180.0);
    for (xcd_2 = 0; xcd_2 < *(int *)(map_x + 8); xcd_2 = xcd_2 + 1) {
      for (ycd_2 = 0; ycd_2 < *(int *)(map_x + 0xc); ycd_2 = ycd_2 + 1) {
        fVar9 = ((float)(ycd_2 - (int)(_Var11 - 1.0)) * 3.1415927) /
                (float)(*(int *)(map_x + 0xc) / 2);
        fVar10 = ((float)(xcd_2 - (int)(_Var12 - 1.0)) * 1.5707964) /
                 (float)(*(int *)(map_x + 8) / 2);
        dVar13 = std::cos((double)(ulong)(uint)fVar10);
        dVar14 = std::cos((double)(ulong)(uint)fVar9);
        Pz_1 = SUB84(dVar13,0) * SUB84(dVar14,0);
        dVar13 = std::cos((double)(ulong)(uint)fVar10);
        dVar14 = std::sin((double)(ulong)(uint)fVar9);
        R_1 = SUB84(dVar13,0) * SUB84(dVar14,0);
        dVar13 = std::sin((double)(ulong)(uint)fVar10);
        PxR_1 = SUB84(dVar13,0);
        if ((((angley != 0.0) || (NAN(angley))) || (anglex != 0.0)) || (NAN(anglex))) {
          dVar13 = std::cos((double)(ulong)(uint)fVar7);
          dVar14 = std::sin((double)(ulong)(uint)fVar7);
          fVar9 = SUB84(dVar13,0) * R_1 + -(SUB84(dVar14,0) * PxR_1);
          dVar13 = std::sin((double)(ulong)(uint)fVar7);
          dVar14 = std::cos((double)(ulong)(uint)fVar7);
          PxR_1 = SUB84(dVar13,0) * R_1 + SUB84(dVar14,0) * PxR_1;
          dVar13 = std::cos((double)(ulong)(uint)fVar8);
          dVar14 = std::sin((double)(ulong)(uint)fVar8);
          dVar15 = std::sin((double)(ulong)(uint)fVar8);
          dVar16 = std::cos((double)(ulong)(uint)fVar8);
          R_1 = SUB84(dVar15,0) * Pz_1 + SUB84(dVar16,0) * fVar9;
          Pz_1 = SUB84(dVar13,0) * Pz_1 + -(SUB84(dVar14,0) * fVar9);
        }
        if (((Pz_1 != 0.0) || (R_1 != 0.0)) || ((PxR_1 != 0.0 || (NAN(PxR_1))))) {
          dVar13 = std::sqrt((double)(ulong)(uint)(Pz_1 * Pz_1 + R_1 * R_1));
          dVar13 = std::atan2(dVar13,(double)(ulong)(uint)PxR_1);
          PyR_1 = (SUB84(dVar13,0) * 2.0) / 6.2831855;
        }
        else {
          PyR_1 = 0.0;
        }
        if (((Pz_1 != 0.0) || (PxR_1 != 0.0)) || (NAN(PxR_1))) {
          dVar13 = std::atan2((double)(ulong)(uint)R_1,(double)(ulong)(uint)Pz_1);
          lat_1 = SUB84(dVar13,0);
        }
        else {
          lat_1 = 0.0;
        }
        dVar13 = std::cos((double)(ulong)(uint)lat_1);
        iVar1 = *(int *)(map_x + 0xc);
        pfVar4 = cv::Mat::at<float>(map_x,xcd_2,ycd_2);
        *pfVar4 = (PyR_1 * SUB84(dVar13,0) * (float)iVar1) / 2.0 + (float)(int)(_Var11 - 1.0);
        dVar13 = std::sin((double)(ulong)(uint)lat_1);
        iVar1 = *(int *)(map_x + 8);
        pfVar4 = cv::Mat::at<float>(map_y,xcd_2,ycd_2);
        *pfVar4 = (PyR_1 * SUB84(dVar13,0) * (float)iVar1) / 2.0 + (float)(int)(_Var12 - 1.0);
      }
    }
    break;
  case 3:
    _Var11 = std::floor<int>(*(int *)(map_x + 0xc) / 2);
    _Var12 = std::floor<int>(*(int *)(map_x + 8) / 2);
    fVar7 = (float)((-angley * 3.141592653589793) / 180.0);
    fVar8 = (float)((-anglex * 3.141592653589793) / 180.0);
    for (xcd_1 = 0; xcd_1 < *(int *)(map_x + 8); xcd_1 = xcd_1 + 1) {
      for (ycd_1 = 0; ycd_1 < *(int *)(map_x + 0xc); ycd_1 = ycd_1 + 1) {
        fVar9 = ((float)(ycd_1 - (int)(_Var11 - 1.0)) * 3.1415927) /
                (float)(*(int *)(map_x + 0xc) / 2);
        fVar10 = ((float)(xcd_1 - (int)(_Var12 - 1.0)) * 1.5707964) /
                 (float)(*(int *)(map_x + 8) / 2);
        dVar13 = std::cos((double)(ulong)(uint)fVar10);
        dVar14 = std::cos((double)(ulong)(uint)fVar9);
        Pz = SUB84(dVar13,0) * SUB84(dVar14,0);
        dVar13 = std::cos((double)(ulong)(uint)fVar10);
        dVar14 = std::sin((double)(ulong)(uint)fVar9);
        R = SUB84(dVar13,0) * SUB84(dVar14,0);
        dVar13 = std::sin((double)(ulong)(uint)fVar10);
        PxR = SUB84(dVar13,0);
        if ((((angley != 0.0) || (NAN(angley))) || (anglex != 0.0)) || (NAN(anglex))) {
          dVar13 = std::cos((double)(ulong)(uint)fVar7);
          dVar14 = std::sin((double)(ulong)(uint)fVar7);
          fVar9 = SUB84(dVar13,0) * R + -(SUB84(dVar14,0) * PxR);
          dVar13 = std::sin((double)(ulong)(uint)fVar7);
          dVar14 = std::cos((double)(ulong)(uint)fVar7);
          PxR = SUB84(dVar13,0) * R + SUB84(dVar14,0) * PxR;
          dVar13 = std::cos((double)(ulong)(uint)fVar8);
          dVar14 = std::sin((double)(ulong)(uint)fVar8);
          dVar15 = std::sin((double)(ulong)(uint)fVar8);
          dVar16 = std::cos((double)(ulong)(uint)fVar8);
          R = SUB84(dVar15,0) * Pz + SUB84(dVar16,0) * fVar9;
          Pz = SUB84(dVar13,0) * Pz + -(SUB84(dVar14,0) * fVar9);
        }
        if (((Pz != 0.0) || (R != 0.0)) || ((PxR != 0.0 || (NAN(PxR))))) {
          dVar13 = std::sqrt((double)(ulong)(uint)(Pz * Pz + PxR * PxR));
          std::atan2(dVar13,(double)(ulong)(uint)R);
        }
        if (((Pz != 0.0) || (PxR != 0.0)) || (NAN(PxR))) {
          std::atan2((double)(ulong)(uint)PxR,(double)(ulong)(uint)Pz);
        }
        iVar1 = *(int *)(map_x + 0xc);
        pfVar4 = cv::Mat::at<float>(map_x,xcd_1,ycd_1);
        *pfVar4 = (-Pz * (float)iVar1) / 2.0 + (float)(int)(_Var11 - 1.0);
        iVar1 = *(int *)(map_x + 8);
        pfVar4 = cv::Mat::at<float>(map_y,xcd_1,ycd_1);
        *pfVar4 = (R * (float)iVar1) / 2.0 + (float)(int)(_Var12 - 1.0);
      }
    }
    break;
  case 4:
    cv::Mat::Mat(local_90);
    cv::Mat::Mat(local_f0);
    cv::Mat::Mat(local_150);
    cv::Mat::Mat(local_1b0);
    cv::Mat::Mat(local_210);
    cv::Mat::Mat(local_270);
    cv::Mat::Mat(local_2d0);
    cv::Mat::Mat(local_330);
    cv::Mat::Mat(local_390);
    cv::Mat::Mat((Mat *)local_3f0);
    std::__cxx11::string::string((string *)&local_410,(string *)&strpathtowarpfile_abi_cxx11_);
    ReadMesh(&local_410);
    std::__cxx11::string::~string((string *)&local_410);
    local_420 = *(int *)(map_x + 8) / (int)meshu._8_4_;
    local_424 = *(int *)(map_x + 0xc) / (int)meshu._12_4_;
    cv::_InputArray::_InputArray(&local_440,(Mat *)meshu);
    cv::_OutputArray::_OutputArray(&local_458,local_90);
    cv::Size_<int>::Size_
              (&local_460,*(int *)(map_x + 0xc) + local_424,*(int *)(map_x + 8) + local_420);
    cv::resize(0x4000000000000000,&local_440,&local_458,&local_460,1);
    cv::_OutputArray::~_OutputArray(&local_458);
    cv::_InputArray::~_InputArray(&local_440);
    cv::_InputArray::_InputArray(&local_478,(Mat *)meshv);
    cv::_OutputArray::_OutputArray(&local_490,local_f0);
    cv::Size_<int>::Size_
              (&local_498,*(int *)(map_x + 0xc) + local_424,*(int *)(map_x + 8) + local_420);
    cv::resize(0x4000000000000000,&local_478,&local_490,&local_498,1);
    cv::_OutputArray::~_OutputArray(&local_490);
    cv::_InputArray::~_InputArray(&local_478);
    cv::_InputArray::_InputArray(&local_4b0,(Mat *)meshi);
    cv::_OutputArray::_OutputArray(&local_4c8,local_210);
    cv::MatSize::operator()(local_4d0);
    cv::resize(0x4000000000000000,&local_4b0,&local_4c8,local_4d0,1);
    cv::_OutputArray::~_OutputArray(&local_4c8);
    cv::_InputArray::~_InputArray(&local_4b0);
    local_600 = local_5f8;
    cv::Mat::Mat(local_600,local_210);
    local_600 = local_598;
    cv::Mat::Mat(local_600,local_210);
    local_600 = local_538;
    cv::Mat::Mat(local_600,local_210);
    cv::_OutputArray::_OutputArray(&local_618,(Mat *)I);
    cv::merge(local_5f8,3,&local_618);
    cv::_OutputArray::~_OutputArray(&local_618);
    cv::operator*((double)(*(int *)(map_x + 0xc) + -1),local_778);
    cv::Mat::operator=((Mat *)local_3f0,(MatExpr *)local_778);
    cv::MatExpr::~MatExpr((MatExpr *)local_778);
    cv::_OutputArray::_OutputArray(&local_790,local_270);
    cv::Mat::convertTo((_OutputArray *)local_3f0,(int)&local_790,1.0,0.0);
    cv::_OutputArray::~_OutputArray(&local_790);
    cv::operator*((double)(*(int *)(map_x + 8) + -1),local_8f0);
    cv::Mat::operator=((Mat *)local_3f0,(MatExpr *)local_8f0);
    cv::MatExpr::~MatExpr((MatExpr *)local_8f0);
    cv::_OutputArray::_OutputArray((_OutputArray *)&colstodiscard,local_2d0);
    cv::Mat::convertTo((_OutputArray *)local_3f0,(int)&colstodiscard,1.0,0.0);
    cv::_OutputArray::~_OutputArray((_OutputArray *)&colstodiscard);
    iVar1 = (int)((long)((ulong)(uint)((int)((long)*(int *)(map_x + 8) / (long)(int)meshu._8_4_) >>
                                      0x1f) << 0x20 |
                        (long)*(int *)(map_x + 8) / (long)(int)meshu._8_4_ & 0xffffffffU) / 2);
    iVar2 = (int)((long)((ulong)(uint)((int)((long)*(int *)(map_x + 0xc) / (long)(int)meshu._12_4_)
                                      >> 0x1f) << 0x20 |
                        (long)*(int *)(map_x + 0xc) / (long)(int)meshu._12_4_ & 0xffffffffU) / 2);
    for (xcd = 0; xcd < *(int *)(map_x + 8); xcd = xcd + 1) {
      for (ycd = 0; ycd < *(int *)(map_x + 0xc); ycd = ycd + 1) {
        piVar3 = cv::Mat::at<int>(local_270,xcd + iVar1,ycd + iVar2);
        iVar5 = *piVar3;
        pfVar4 = cv::Mat::at<float>(map_x,xcd,ycd);
        *pfVar4 = (float)iVar5;
        piVar3 = cv::Mat::at<int>(local_2d0,xcd + iVar1,ycd + iVar2);
        iVar5 = *piVar3;
        pfVar4 = cv::Mat::at<float>(map_y,xcd,ycd);
        *pfVar4 = (float)iVar5;
      }
    }
    local_ad0 = aMStack_4d8;
    do {
      local_ad0 = local_ad0 + -0x60;
      cv::Mat::~Mat(local_ad0);
    } while (local_ad0 != local_5f8);
    cv::Mat::~Mat((Mat *)local_3f0);
    cv::Mat::~Mat(local_390);
    cv::Mat::~Mat(local_330);
    cv::Mat::~Mat(local_2d0);
    cv::Mat::~Mat(local_270);
    cv::Mat::~Mat(local_210);
    cv::Mat::~Mat(local_1b0);
    cv::Mat::~Mat(local_150);
    cv::Mat::~Mat(local_f0);
    cv::Mat::~Mat(local_90);
    break;
  case 5:
    update_map(anglex,angley,(Mat *)map2x,(Mat *)map2y,1);
  }
  return;
}

Assistant:

void update_map( double anglex, double angley, Mat &map_x, Mat &map_y, int transformtype )
{
	// explanation comments are most verbose in the last 
	// default (transformtype == 0) section
	switch (transformtype)
	{
	case 5: // 360 to 180 fisheye and then to warped
	//if (transformtype == 5)	
	{
		// create temp maps to the texture and then map from texture to output
		// this will need 2 remaps at the output side
		// and two sets of map files
		
		// the map file for the first remap has to change with change of anglex angley
		// the second one, for fisheye to warped, doesn't need to be recalculated.
		
		// so, update_map is called first to initialize map_x and map_y
		// using transformtype = 4
		
		// and later, and at all other times, only the map to the texture is updated.
		
		update_map( anglex, angley, map2x, map2y, 1 );
		
	}
		break;
		
	case 4:
	//if (transformtype == 4)	//  fisheye to warped
	{
		// similar to TGAWarp at http://paulbourke.net/dome/tgawarp/
		//
		
		Mat U, V, X, Y, IC1;
		Mat indexu, indexv, indexx, indexy, temp;
		ReadMesh(strpathtowarpfile);
		//resize(meshx, X, map_x.size(), INTER_LINEAR);
		//resize(meshy, Y, map_x.size(), INTER_LINEAR);
		//debug - changed INTER_LINEAR to INTER_LANCZOS4 and later INTER_CUBIC
		// not much of a penalty, so we leave it in.
		
		// discard the top/bottom line of U and V, since they cause
		// the bottom of the image to be repeats of the same
		//~ Mat meshub, meshvb;
		//~ meshu(cv::Rect(0,0,meshu.cols,(meshu.rows-1))).copyTo(meshub);
		//~ meshv(cv::Rect(0,0,meshv.cols,(meshv.rows-1))).copyTo(meshvb);
		// this doesn't work
		
		// for per pixel equivalence with GL_warp, the following seems to be needed
		int extrarows = map_x.rows / meshu.rows ;
		int extracols = map_x.cols / meshu.cols;
		resize(meshu, U, Size(map_x.cols+extracols, (map_x.rows+extrarows)), INTER_CUBIC);
		resize(meshv, V, Size(map_x.cols+extracols, (map_x.rows+extrarows)), INTER_CUBIC);
		
		//resize(meshu, U, map_x.size(), INTER_CUBIC);
		//resize(meshv, V, map_x.size(), INTER_CUBIC);
		resize(meshi, IC1, map_x.size(), INTER_CUBIC);
		
		// I.convertTo(I, CV_32FC3); //this doesn't work 	
		//convert to 3 channel Mat, for later multiplication
		// https://stackoverflow.com/questions/23303305/opencv-element-wise-matrix-multiplication/23310109
		Mat t[] = {IC1, IC1, IC1};
		merge(t, 3, I);
		
		// map the values which are [minx,maxx] to [0,map_x.cols-1]
		//~ temp = (map_x.cols-1)*(X - minx)/(maxx-minx);
		//~ temp.convertTo(indexx, CV_32S);		// this does the rounding to int
		
		//~ temp = (map_x.rows-1)*(Y+1)/2;	// assuming miny=-1, maxy=1
		//~ temp.convertTo(indexy, CV_32S);
		
		temp = (map_x.cols-1)*U;	// assuming minu=0, maxu=1
		temp.convertTo(indexu, CV_32S);		// this does the rounding to int
		
		temp = (map_x.rows-1)*V;	// assuming minv=0, maxv=1
		//~ temp = (map_x.rows)*(V-minv)/(maxv-minv);
		temp.convertTo(indexv, CV_32S);
		
		int linestodiscard = map_x.rows / meshu.rows / 2;
		int colstodiscard = map_x.cols / meshu.cols / 2;
		
		for ( int i = 0; i < (map_x.rows); i++ ) // here, i is for y and j is for x
			{
				for ( int j = 0; j < map_x.cols; j++ )
				{
					//~ map_x.at<float>(i, j) = (float)(j); // this just maps input to output
				    //~ map_y.at<float>(i, j) = (float)(i); 
				    
				    // in the following, we assume indexx.at<int>(i,j) = j
				    // and indexy.at<int>(i,j) = i
				    // otherwise, a mesh effect due to discontinuities in indexx and indexy.
				    	
					map_x.at<float>(i,j) = (float) indexu.at<int>(i+linestodiscard,j+colstodiscard);
					map_y.at<float>(i,j) = (float) indexv.at<int>(i+linestodiscard,j+colstodiscard);
					
				} //end for j
			} //end for i
		return;
	}
	break;
		
	case 3:
	//if (transformtype == 3)	//  fisheye to Equirectangular - dual output - using parallel projection
	{
		// int xcd = floor(map_x.cols/2) - 1 + anglex;	// this just 'pans' the view
		// int ycd = floor(map_x.rows/2) - 1 + angley;
		int xcd = floor(map_x.cols/2) - 1 ;
		int ycd = floor(map_x.rows/2) - 1 ;
		 
		float px_per_theta = map_x.cols * 2 / (2*CV_PI); 	// src width = map_x.cols * 2
		float px_per_phi   = map_x.rows / CV_PI;			// src height = PI for equirect 360
		float rad_per_px = CV_PI / map_x.rows;
		float theta;
		float longi, lat, Px, Py, Pz, R;						// X and Y are map_x and map_y
		float PxR, PyR, PzR;
		float aperture = CV_PI;	// this is the only change between type 2 & 3
		float angleyrad = -angley*CV_PI/180;	// made these minus for more intuitive feel
		float anglexrad = -anglex*CV_PI/180;
		
		
		for ( int i = 0; i < map_x.rows; i++ ) // here, i is for y and j is for x
			{
				for ( int j = 0; j < map_x.cols; j++ )
				{
					longi 	= (CV_PI    ) * (j - xcd) / (map_x.cols/2);		// longi = x.pi for 360 image
					lat	 	= (CV_PI / 2) * (i - ycd) / (map_x.rows/2);		// lat = y.pi/2
					
					Px = cos(lat)*cos(longi);
					Py = cos(lat)*sin(longi);
					Pz = sin(lat);
					
					if(angley!=0 || anglex!=0)
					{
						// cos(angleyrad), 0, sin(angleyrad), 0, 1, 0, -sin(angleyrad), 0, cos(angleyrad));
						
						PxR = Px;
						PyR = cos(angleyrad) * Py - sin(angleyrad) * Pz;
						PzR = sin(angleyrad) * Py + cos(angleyrad) * Pz;
						
						Px = cos(anglexrad) * PxR - sin(anglexrad) * PyR;
						Py = sin(anglexrad) * PxR + cos(anglexrad) * PyR;
						Pz = PzR;
					}
					
					
					if (Px == 0 && Py == 0 && Pz == 0)
						R = 0;
					else 
						R = 2 * atan2(sqrt(Px*Px + Pz*Pz), Py) / aperture; 	
					
					if (Px == 0 && Pz ==0)
						theta = 0;
					else
						theta = atan2(Pz, Px);
						
					
					// map_x.at<float>(i, j) = R * cos(theta); this maps to [-1, 1]
					//map_x.at<float>(i, j) = R * cos(theta) * map_x.cols / 2 + xcd;
					map_x.at<float>(i, j) = - Px * map_x.cols / 2 + xcd;
					
					// this gives two copies in final output, top one reasonably correct
					
					// map_y.at<float>(i, j) = R * sin(theta); this maps to [-1, 1]
					//map_y.at<float>(i, j) = R * sin(theta) * map_x.rows / 2 + ycd;
					map_y.at<float>(i, j) = Py * map_x.rows / 2 + ycd;
					
				 } // for j
				   
			} // for i
			
	}
	break;
	
	case 2:
	//if (transformtype == 2)	// 360 degree fisheye to Equirectangular 360 
	{
		// int xcd = floor(map_x.cols/2) - 1 + anglex;	// this just 'pans' the view
		// int ycd = floor(map_x.rows/2) - 1 + angley;
		int xcd = floor(map_x.cols/2) - 1 ;
		int ycd = floor(map_x.rows/2) - 1 ;
		 
		float px_per_theta = map_x.cols  / (2*CV_PI); 	//  width = map_x.cols 
		float px_per_phi   = map_x.rows / CV_PI;		//  height = PI for equirect 360
		float rad_per_px = CV_PI / map_x.rows;
		float theta;
		float longi, lat, Px, Py, Pz, R;						// X and Y are map_x and map_y
		float PxR, PyR, PzR;
		float aperture = 2*CV_PI;
		float angleyrad = -angley*CV_PI/180;	// made these minus for more intuitive feel
		float anglexrad = -anglex*CV_PI/180;
		
		for ( int i = 0; i < map_x.rows; i++ ) // here, i is for y and j is for x
			{
				for ( int j = 0; j < map_x.cols; j++ )
				{
					longi 	= (CV_PI    ) * (j - xcd) / (map_x.cols/2);		// longi = x.pi for 360 image
					lat	 	= (CV_PI / 2) * (i - ycd) / (map_x.rows/2);		// lat = y.pi/2
					
					Px = cos(lat)*cos(longi);
					Py = cos(lat)*sin(longi);
					Pz = sin(lat);
					
					if(angley!=0 || anglex!=0)
					{
						// cos(angleyrad), 0, sin(angleyrad), 0, 1, 0, -sin(angleyrad), 0, cos(angleyrad));
						
						PxR = Px;
						PyR = cos(angleyrad) * Py - sin(angleyrad) * Pz;
						PzR = sin(angleyrad) * Py + cos(angleyrad) * Pz;
						
						Px = cos(anglexrad) * PxR - sin(anglexrad) * PyR;
						Py = sin(anglexrad) * PxR + cos(anglexrad) * PyR;
						Pz = PzR;
					}
					
					
					if (Px == 0 && Py == 0 && Pz == 0)
						R = 0;
					else 
						R = 2 * atan2(sqrt(Px*Px + Py*Py), Pz) / aperture; 
						// exchanged Py and Pz from Paul's co-ords, 	
						// from Perspective projection the wrong imaging model 10.1.1.52.8827.pdf
						// http://citeseerx.ist.psu.edu/viewdoc/download?doi=10.1.1.52.8827&rep=rep1&type=pdf
						// Or else, Africa ends up sideways, and with the far east and west streched out on top and bottom
					
					if (Px == 0 && Pz ==0)
						theta = 0;
					else
						theta = atan2(Py, Px);
						
					
					// map_x.at<float>(i, j) = R * cos(theta); this maps to [-1, 1]
					map_x.at<float>(i, j) =  R * cos(theta) * map_x.cols / 2 + xcd;
					
					// currently upside down 
					
					// map_y.at<float>(i, j) = R * sin(theta); this maps to [-1, 1]
					map_y.at<float>(i, j) =  R * sin(theta) * map_x.rows / 2 + ycd;
					
					
				 } // for j
				   
			} // for i
			
	}
	break;
	
	case 1:
	//if (transformtype == 1)	// Equirectangular 360 to 180 degree fisheye
	{
		// using the transformations at
		// http://paulbourke.net/dome/dualfish2sphere/diagram.pdf
		int xcd = floor(map_x.cols/2) - 1 ;
		int ycd = floor(map_x.rows/2) - 1 ;
		float halfcols = map_x.cols/2;
		float halfrows = map_x.rows/2;
		
		
		float longi, lat, Px, Py, Pz, theta;						// X and Y are map_x and map_y
		float xfish, yfish, rfish, phi, xequi, yequi;
		float PxR, PyR, PzR;
		float aperture = CV_PI;
		float angleyrad = -angley*CV_PI/180;	// made these minus for more intuitive feel
		float anglexrad = -anglex*CV_PI/180;
		
		//Mat inputmatrix, rotationmatrix, outputmatrix;
		// https://en.wikipedia.org/wiki/Rotation_matrix#Basic_rotations
		//rotationmatrix = (Mat_<float>(3,3) << cos(angleyrad), 0, sin(angleyrad), 0, 1, 0, -sin(angleyrad), 0, cos(angleyrad)); //y
		//rotationmatrix = (Mat_<float>(3,3) << 1, 0, 0, 0, cos(angleyrad), -sin(angleyrad), 0, sin(angleyrad), cos(angleyrad)); //x
		//rotationmatrix = (Mat_<float>(3,3) << cos(angleyrad), -sin(angleyrad), 0, sin(angleyrad), cos(angleyrad), 0, 0, 0, 1); //z
		
		for ( int i = 0; i < map_x.rows; i++ ) // here, i is for y and j is for x
			{
				for ( int j = 0; j < map_x.cols; j++ )
				{
					// normalizing to [-1, 1]
					xfish = (j - xcd) / halfcols;
					yfish = (i - ycd) / halfrows;
					rfish = sqrt(xfish*xfish + yfish*yfish);
					theta = atan2(yfish, xfish);
					phi = rfish*aperture/2;
					
					// Paul's co-ords - this is suitable when phi=0 is Pz=0
					
					//Px = cos(phi)*cos(theta);
					//Py = cos(phi)*sin(theta);
					//Pz = sin(phi);
					
					// standard co-ords - this is suitable when phi=pi/2 is Pz=0
					Px = sin(phi)*cos(theta);
					Py = sin(phi)*sin(theta);
					Pz = cos(phi);
					
					if(angley!=0 || anglex!=0)
					{
						// cos(angleyrad), 0, sin(angleyrad), 0, 1, 0, -sin(angleyrad), 0, cos(angleyrad));
						
						PxR = Px;
						PyR = cos(angleyrad) * Py - sin(angleyrad) * Pz;
						PzR = sin(angleyrad) * Py + cos(angleyrad) * Pz;
						
						Px = cos(anglexrad) * PxR - sin(anglexrad) * PyR;
						Py = sin(anglexrad) * PxR + cos(anglexrad) * PyR;
						Pz = PzR;
					}
					
					
					longi 	= atan2(Py, Px);
					lat	 	= atan2(Pz,sqrt(Px*Px + Py*Py));	
					// this gives south pole centred, ie yequi goes from [-1, 0]
					// Made into north pole centred by - (minus) in the final map_y assignment
					
					xequi = longi / CV_PI;
					// this maps to [-1, 1]
					yequi = 2*lat / CV_PI;
					// this maps to [-1, 0] for south pole
					
					//if (rfish <= 1.0)		// outside that circle, let it be black
					// removed the black circle to help transformtype=5
					// avoid bottom pixels black
					{
						map_x.at<float>(i, j) =  abs(xequi * map_x.cols / 2 + xcd);
						//map_y.at<float>(i, j) =  yequi * map_x.rows / 2 + ycd;
						// this gets south pole centred view
						
						// the abs is to correct for -0.5 xequi value at longi=0
						
						map_y.at<float>(i, j) =  yequi * map_x.rows / 2 + ycd;
						//debug
						//~ if (rfish <= 1.0/500)
						//if ((longi==0)||(longi==CV_PI)||(longi==-CV_PI))
						//if (lat==0)	// since these are floats, probably doesn't work
						//~ {
							//~ std::cout << "i,j,mapx,mapy=";
							//~ std::cout << i << ", ";
							//~ std::cout << j << ", ";
							//~ std::cout << map_x.at<float>(i, j) << ", ";
							//~ std::cout << map_y.at<float>(i, j) << std::endl;
						//~ }
					}
					
				 } // for j
				   
			} // for i
			
	}
	break;
	
	case 0:
	default:
	//else
	//if (transformtype == 0) // the default // Equirectangular 360 to 360 degree fisheye
	{
			
		//////////////////////////////////////
		// the following code is similar to transformtype=1 code
		// with only the "aperture" changed to 2pi	
		int xcd = floor(map_x.cols/2) - 1 ;
		int ycd = floor(map_x.rows/2) - 1 ;
		float halfcols = map_x.cols/2;
		float halfrows = map_x.rows/2;
		
		
		float longi, lat, Px, Py, Pz, theta;						// X and Y are map_x and map_y
		float xfish, yfish, rfish, phi, xequi, yequi;
		float PxR, PyR, PzR;
		float aperture = 2*CV_PI;
		float angleyrad = -angley*CV_PI/180;	// made these minus for more intuitive feel
		float anglexrad = -anglex*CV_PI/180;
		
		//Mat inputmatrix, rotationmatrix, outputmatrix;
		// https://en.wikipedia.org/wiki/Rotation_matrix#Basic_rotations
		//rotationmatrix = (Mat_<float>(3,3) << cos(angleyrad), 0, sin(angleyrad), 0, 1, 0, -sin(angleyrad), 0, cos(angleyrad)); //y
		//rotationmatrix = (Mat_<float>(3,3) << 1, 0, 0, 0, cos(angleyrad), -sin(angleyrad), 0, sin(angleyrad), cos(angleyrad)); //x
		//rotationmatrix = (Mat_<float>(3,3) << cos(angleyrad), -sin(angleyrad), 0, sin(angleyrad), cos(angleyrad), 0, 0, 0, 1); //z
		
		for ( int i = 0; i < map_x.rows; i++ ) // here, i is for y and j is for x
			{
				for ( int j = 0; j < map_x.cols; j++ )
				{
					// normalizing to [-1, 1]
					xfish = (j - xcd) / halfcols;
					yfish = (i - ycd) / halfrows;
					rfish = sqrt(xfish*xfish + yfish*yfish);
					theta = atan2(yfish, xfish);
					phi = rfish*aperture/2;
					
					// Paul's co-ords - this is suitable when phi=0 is Pz=0
					
					//Px = cos(phi)*cos(theta);
					//Py = cos(phi)*sin(theta);
					//Pz = sin(phi);
					
					// standard co-ords - this is suitable when phi=pi/2 is Pz=0
					Px = sin(phi)*cos(theta);
					Py = sin(phi)*sin(theta);
					Pz = cos(phi);
					
					if(angley!=0 || anglex!=0)
					{
						// cos(angleyrad), 0, sin(angleyrad), 0, 1, 0, -sin(angleyrad), 0, cos(angleyrad));
						
						PxR = Px;
						PyR = cos(angleyrad) * Py - sin(angleyrad) * Pz;
						PzR = sin(angleyrad) * Py + cos(angleyrad) * Pz;
						
						Px = cos(anglexrad) * PxR - sin(anglexrad) * PyR;
						Py = sin(anglexrad) * PxR + cos(anglexrad) * PyR;
						Pz = PzR;
					}
					
					
					longi 	= atan2(Py, Px);
					lat	 	= atan2(Pz,sqrt(Px*Px + Py*Py));	
					// this gives south pole centred, ie yequi goes from [-1, 0]
					// Made into north pole centred by - (minus) in the final map_y assignment
					
					xequi = longi / CV_PI;
					// this maps to [-1, 1]
					yequi = 2*lat / CV_PI;
					// this maps to [-1, 0] for south pole
					
					if (rfish <= 1.1)		// outside that circle, let it be black
					// restored the black circle 
					// to help transformtype=5
					// avoid bottom pixels black, made it 1.1 instead of 1.0
					{
						map_x.at<float>(i, j) =  abs(xequi * map_x.cols / 2 + xcd);
						//map_y.at<float>(i, j) =  yequi * map_x.rows / 2 + ycd;
						// this gets south pole centred view
						
						// the abs is to correct for -0.5 xequi value at longi=0
						
						map_y.at<float>(i, j) =  yequi * map_x.rows / 2 + ycd;
						
					}
					
				 } // for j
				   
			} // for i
	 
     } // end of if transformtype == 0
	}	// end switch case
    
}